

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryTypeHandler.cpp
# Opt level: O2

bool __thiscall
Js::DictionaryTypeHandlerBase<unsigned_short>::NextLetConstGlobal
          (DictionaryTypeHandlerBase<unsigned_short> *this,int *index,RootObjectBase *instance,
          PropertyRecord **propertyRecord,Var *value,bool *isConst)

{
  BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_00;
  unsigned_short uVar1;
  DictionaryPropertyDescriptor<unsigned_short> *pDVar2;
  PropertyRecord **ppPVar3;
  Var pvVar4;
  int iVar5;
  int index_00;
  DictionaryPropertyDescriptor<unsigned_short> local_50;
  DictionaryPropertyDescriptor<unsigned_short> descriptor;
  
  index_00 = *index;
  descriptor = (DictionaryPropertyDescriptor<unsigned_short>)isConst;
  do {
    this_00 = (this->propertyMap).ptr;
    iVar5 = this_00->count - this_00->freeCount;
    if (iVar5 <= index_00) {
LAB_00c23c4a:
      return index_00 < iVar5;
    }
    pDVar2 = JsUtil::
             BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
             ::GetValueAt(this_00,index_00);
    local_50 = *pDVar2;
    if ((local_50._0_4_ >> 0xc & 1) != 0) {
      ppPVar3 = JsUtil::
                BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                ::GetKeyAt((this->propertyMap).ptr,*index);
      *propertyRecord = *ppPVar3;
      uVar1 = DictionaryPropertyDescriptor<unsigned_short>::GetDataPropertyIndex<true>(&local_50);
      pvVar4 = DynamicObject::GetSlot(&instance->super_DynamicObject,(uint)uVar1);
      *value = pvVar4;
      *(PropertyAttributes *)descriptor = local_50.Attributes >> 7;
      *index = *index + 1;
      goto LAB_00c23c4a;
    }
    index_00 = *index + 1;
    *index = index_00;
  } while( true );
}

Assistant:

bool DictionaryTypeHandlerBase<T>::NextLetConstGlobal(int& index, RootObjectBase* instance, const PropertyRecord** propertyRecord, Var* value, bool* isConst)
    {
        for (; index < propertyMap->Count(); index++)
        {
            DictionaryPropertyDescriptor<T> descriptor = propertyMap->GetValueAt(index);

            if (descriptor.Attributes & PropertyLetConstGlobal)
            {
                *propertyRecord = propertyMap->GetKeyAt(index);
                *value = instance->GetSlot(descriptor.template GetDataPropertyIndex<true>());
                *isConst = (descriptor.Attributes & PropertyConst) != 0;

                index += 1;

                return true;
            }
        }

        return false;
    }